

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void EV_StartLightStrobing(int tag,int upper,int lower,int utics,int ltics)

{
  DSectorEffect *pDVar1;
  DStrobe *this;
  sector_t_conflict *len;
  sector_t_conflict *sector;
  sector_t *sec;
  FSectorTagIterator it;
  int secnum;
  int ltics_local;
  int utics_local;
  int lower_local;
  int upper_local;
  int tag_local;
  
  len = (sector_t_conflict *)(ulong)(uint)tag;
  it.start = ltics;
  FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)&sec,tag);
  while (it.searchtag = FSectorTagIterator::Next((FSectorTagIterator *)&sec), -1 < it.searchtag) {
    sector = sectors + it.searchtag;
    pDVar1 = TObjPtr::operator_cast_to_DSectorEffect_((TObjPtr *)&sector->lightingdata);
    if (pDVar1 == (DSectorEffect *)0x0) {
      this = (DStrobe *)DObject::operator_new((DObject *)0x58,(size_t)len);
      DStrobe::DStrobe(this,(sector_t *)sector,upper,lower,utics,it.start);
      len = sector;
    }
  }
  return;
}

Assistant:

void EV_StartLightStrobing (int tag, int upper, int lower, int utics, int ltics)
{
	int secnum;
	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sector_t *sec = &sectors[secnum];
		if (sec->lightingdata)
			continue;
		
		new DStrobe (sec, upper, lower, utics, ltics);
	}
}